

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> __thiscall
flatbuffers::NewLuaBfbsGenerator(flatbuffers *this,string *flatc_version)

{
  LuaBfbsGenerator *this_00;
  unique_ptr<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator>_>
  local_20;
  string *local_18;
  string *flatc_version_local;
  
  local_18 = flatc_version;
  flatc_version_local = (string *)this;
  this_00 = (LuaBfbsGenerator *)operator_new(0x270);
  anon_unknown_25::LuaBfbsGenerator::LuaBfbsGenerator(this_00,local_18);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator>>
  ::unique_ptr<std::default_delete<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator>,void>
            ((unique_ptr<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator>>
              *)&local_20,this_00);
  std::unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>::
  unique_ptr<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator>,void>
            ((unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>
              *)this,&local_20);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::LuaBfbsGenerator>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CodeGenerator> NewLuaBfbsGenerator(
    const std::string &flatc_version) {
  return std::unique_ptr<LuaBfbsGenerator>(new LuaBfbsGenerator(flatc_version));
}